

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

void __thiscall
cni_namespace_impl::cni_register::cni_register<cs_impl::any>
          (cni_register *this,namespace_t *ns,char *name,any *val)

{
  name_space *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (ns->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  cs::name_space::add_var(this_00,&local_38,val);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

cni_register(const cs::namespace_t &ns, const char *name, T &&val)
		{
			ns->add_var(name, std::forward<T>(val));
		}